

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O0

REF_STATUS ref_swap_conforming(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_DBL *pRVar1;
  REF_CELL ref_cell_00;
  REF_NODE ref_node_00;
  bool bVar2;
  REF_STATUS RVar3;
  bool local_26b;
  double local_268;
  double local_258;
  double local_248;
  double local_238;
  double local_230;
  double local_228;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL dot;
  REF_DBL normal3 [3];
  double local_178;
  REF_DBL normal2 [3];
  double local_158;
  REF_DBL normal1 [3];
  double local_138;
  REF_DBL normal0 [3];
  REF_BOOL supported;
  REF_BOOL uv_area_allowed;
  REF_BOOL normdev_allowed;
  REF_DBL area3;
  REF_DBL area2;
  REF_DBL uv_area3;
  REF_DBL uv_area2;
  REF_DBL sign_uv_area;
  REF_DBL normdev3;
  REF_DBL normdev2;
  REF_DBL normdev1;
  REF_DBL normdev0;
  REF_BOOL cell1_support;
  REF_BOOL cell0_support;
  REF_INT node3;
  REF_INT node2;
  REF_INT nodes [27];
  REF_INT cell_to_swap [2];
  REF_INT ncell;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_cell_00 = ref_grid->cell[3];
  ref_node_00 = ref_grid->node;
  unique0x00012000 = ref_grid->geom;
  *allowed = 0;
  ref_grid_local._4_4_ = ref_swap_node23(ref_grid,node0,node1,&cell0_support,&cell1_support);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_cell_list_with2(ref_cell_00,node0,node1,2,cell_to_swap,nodes + 0x19);
    if (ref_grid_local._4_4_ == 0) {
      if ((long)cell_to_swap[0] == 2) {
        ref_grid_local._4_4_ = ref_cell_nodes(ref_cell_00,nodes[0x19],&node3);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ =
               ref_geom_tri_supported
                         (stack0xffffffffffffffc0,&node3,(REF_BOOL *)((long)&normdev0 + 4));
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = ref_cell_nodes(ref_cell_00,nodes[0x1a],&node3);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid_local._4_4_ =
                   ref_geom_tri_supported(stack0xffffffffffffffc0,&node3,(REF_BOOL *)&normdev0);
              if (ref_grid_local._4_4_ == 0) {
                node3 = node0;
                if ((normdev0._4_4_ == 0) || (normdev0._0_4_ == 0)) {
                  ref_grid_local._4_4_ = ref_cell_nodes(ref_cell_00,nodes[0x19],&node3);
                  if (ref_grid_local._4_4_ == 0) {
                    ref_grid_local._4_4_ = ref_node_tri_normal(ref_node_00,&node3,&local_138);
                    if (ref_grid_local._4_4_ == 0) {
                      ref_grid_local._4_4_ = ref_math_normalize(&local_138);
                      if (ref_grid_local._4_4_ == 0) {
                        ref_grid_local._4_4_ = ref_cell_nodes(ref_cell_00,nodes[0x1a],&node3);
                        if (ref_grid_local._4_4_ == 0) {
                          ref_grid_local._4_4_ = ref_node_tri_normal(ref_node_00,&node3,&local_158);
                          if (ref_grid_local._4_4_ == 0) {
                            ref_grid_local._4_4_ = ref_math_normalize(&local_158);
                            if (ref_grid_local._4_4_ == 0) {
                              if (ref_node_00->same_normal_tol <=
                                  normal0[1] * normal1[1] +
                                  local_138 * local_158 + normal0[0] * normal1[0]) {
                                node2 = cell1_support;
                                nodes[0] = cell0_support;
                                ref_grid_local._4_4_ =
                                     ref_node_tri_normal(ref_node_00,&node3,&local_178);
                                if (ref_grid_local._4_4_ == 0) {
                                  node2 = cell0_support;
                                  nodes[0] = cell1_support;
                                  node3 = node1;
                                  ref_grid_local._4_4_ =
                                       ref_node_tri_normal(ref_node_00,&node3,&dot);
                                  if (ref_grid_local._4_4_ == 0) {
                                    if (normal3[1] * normal3[1] +
                                        dot * dot + normal3[0] * normal3[0] <=
                                        normal2[1] * normal2[1] +
                                        local_178 * local_178 + normal2[0] * normal2[0]) {
                                      local_228 = normal3[1] * normal3[1] +
                                                  dot * dot + normal3[0] * normal3[0];
                                    }
                                    else {
                                      local_228 = normal2[1] * normal2[1] +
                                                  local_178 * local_178 + normal2[0] * normal2[0];
                                    }
                                    if (local_228 * 1e+20 <= 0.0) {
                                      local_230 = -(local_228 * 1e+20);
                                    }
                                    else {
                                      local_230 = local_228 * 1e+20;
                                    }
                                    if (1.0 < local_230) {
                                      ref_grid_local._4_4_ = ref_math_normalize(&local_178);
                                      if (ref_grid_local._4_4_ == 0) {
                                        ref_grid_local._4_4_ = ref_math_normalize(&dot);
                                        if (ref_grid_local._4_4_ == 0) {
                                          if (ref_node_00->same_normal_tol <=
                                              normal2[1] * normal3[1] +
                                              local_178 * dot + normal2[0] * normal3[0]) {
                                            *allowed = 1;
                                            ref_grid_local._4_4_ = 0;
                                          }
                                          else {
                                            *allowed = 0;
                                            ref_grid_local._4_4_ = 0;
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                                 ,0x22b,"ref_swap_conforming",
                                                 (ulong)ref_grid_local._4_4_,
                                                 "triangle 3 has zero area");
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                               ,0x22a,"ref_swap_conforming",
                                               (ulong)ref_grid_local._4_4_,
                                               "triangle 2 has zero area");
                                      }
                                    }
                                    else {
                                      *allowed = 0;
                                      ref_grid_local._4_4_ = 0;
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                           ,0x224,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,
                                           "tri 3 normal");
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                         ,0x220,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,
                                         "tri 2 normal");
                                }
                              }
                              else {
                                *allowed = 0;
                                ref_grid_local._4_4_ = 0;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                     ,0x217,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,
                                     "triangle 1 has zero area");
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                   ,0x216,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,
                                   "tri 1 normal");
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                 ,0x215,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,"nodes");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                               ,0x214,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,
                               "triangle 0 has zero area");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                             ,0x213,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,"tri 0 normal"
                            );
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                           ,0x212,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,"nodes");
                  }
                }
                else {
                  ref_grid_local._4_4_ = ref_cell_nodes(ref_cell_00,nodes[0x19],&node3);
                  if (ref_grid_local._4_4_ == 0) {
                    ref_grid_local._4_4_ = ref_geom_tri_norm_deviation(ref_grid,&node3,&normdev1);
                    if (ref_grid_local._4_4_ == 0) {
                      ref_grid_local._4_4_ = ref_cell_nodes(ref_cell_00,nodes[0x1a],&node3);
                      if (ref_grid_local._4_4_ == 0) {
                        ref_grid_local._4_4_ =
                             ref_geom_tri_norm_deviation(ref_grid,&node3,&normdev2);
                        if (ref_grid_local._4_4_ == 0) {
                          node2 = cell1_support;
                          nodes[0] = cell0_support;
                          ref_grid_local._4_4_ =
                               ref_geom_cell_tuv_supported
                                         (stack0xffffffffffffffc0,&node3,2,
                                          (REF_BOOL *)((long)normal0 + 0x14));
                          if (ref_grid_local._4_4_ == 0) {
                            if (normal0[2]._4_4_ == 0) {
                              ref_grid_local._4_4_ = 0;
                            }
                            else {
                              RVar3 = ref_geom_tri_norm_deviation(ref_grid,&node3,&normdev3);
                              if (RVar3 == 0) {
                                ref_grid_local._4_4_ =
                                     ref_geom_uv_area(stack0xffffffffffffffc0,&node3,&uv_area3);
                                if (ref_grid_local._4_4_ == 0) {
                                  ref_grid_local._4_4_ =
                                       ref_node_tri_area(ref_node_00,&node3,&area3);
                                  if (ref_grid_local._4_4_ == 0) {
                                    node2 = cell0_support;
                                    nodes[0] = cell1_support;
                                    node3 = node1;
                                    ref_grid_local._4_4_ =
                                         ref_geom_cell_tuv_supported
                                                   (stack0xffffffffffffffc0,&node3,2,
                                                    (REF_BOOL *)((long)normal0 + 0x14));
                                    if (ref_grid_local._4_4_ == 0) {
                                      if (normal0[2]._4_4_ == 0) {
                                        ref_grid_local._4_4_ = 0;
                                      }
                                      else {
                                        RVar3 = ref_geom_tri_norm_deviation
                                                          (ref_grid,&node3,&sign_uv_area);
                                        if (RVar3 == 0) {
                                          ref_grid_local._4_4_ =
                                               ref_geom_uv_area(stack0xffffffffffffffc0,&node3,
                                                                &area2);
                                          if (ref_grid_local._4_4_ == 0) {
                                            ref_grid_local._4_4_ =
                                                 ref_node_tri_area(ref_node_00,&node3,
                                                                   (REF_DBL *)&uv_area_allowed);
                                            if (ref_grid_local._4_4_ == 0) {
                                              if (sign_uv_area <= normdev3) {
                                                local_238 = sign_uv_area;
                                              }
                                              else {
                                                local_238 = normdev3;
                                              }
                                              if (normdev2 <= normdev1) {
                                                local_248 = normdev2;
                                              }
                                              else {
                                                local_248 = normdev1;
                                              }
                                              bVar2 = true;
                                              if (local_238 <= local_248) {
                                                if (sign_uv_area <= normdev3) {
                                                  local_258 = sign_uv_area;
                                                }
                                                else {
                                                  local_258 = normdev3;
                                                }
                                                if (normdev2 <= normdev1) {
                                                  local_268 = normdev2;
                                                }
                                                else {
                                                  local_268 = normdev1;
                                                }
                                                bVar2 = false;
                                                if ((local_268 * 0.9 < local_258) &&
                                                   (pRVar1 = &ref_grid->adapt->post_min_normdev,
                                                   bVar2 = false,
                                                   *pRVar1 <= normdev3 && normdev3 != *pRVar1)) {
                                                  pRVar1 = &ref_grid->adapt->post_min_normdev;
                                                  bVar2 = *pRVar1 <= sign_uv_area &&
                                                          sign_uv_area != *pRVar1;
                                                }
                                              }
                                              local_26b = false;
                                              if ((bVar2) &&
                                                 (local_26b = false,
                                                 ref_node_00->min_volume <= area3 &&
                                                 area3 != ref_node_00->min_volume)) {
                                                local_26b = ref_node_00->min_volume <=
                                                            _uv_area_allowed &&
                                                            _uv_area_allowed !=
                                                            ref_node_00->min_volume;
                                              }
                                              if (stack0xffffffffffffffc0->meshlink == (void *)0x0)
                                              {
                                                ref_grid_local._4_4_ =
                                                     ref_geom_uv_area_sign
                                                               (ref_grid,(&node3)[ref_cell_00->
                                                                                  node_per],
                                                                &uv_area2);
                                                if (ref_grid_local._4_4_ == 0) {
                                                  bVar2 = false;
                                                  if (ref_node_00->min_uv_area <=
                                                      uv_area2 * uv_area3 &&
                                                      uv_area2 * uv_area3 !=
                                                      ref_node_00->min_uv_area) {
                                                    bVar2 = ref_node_00->min_uv_area <=
                                                            uv_area2 * area2 &&
                                                            uv_area2 * area2 !=
                                                            ref_node_00->min_uv_area;
                                                  }
                                                  if ((local_26b == 0) || (!bVar2)) {
                                                    ref_grid_local._4_4_ = 0;
                                                  }
                                                  else {
                                                    *allowed = 1;
                                                    ref_grid_local._4_4_ = 0;
                                                  }
                                                }
                                                else {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                                  ,0x260,"ref_swap_conforming",
                                                  (ulong)ref_grid_local._4_4_,"uv area sign");
                                                }
                                              }
                                              else {
                                                *allowed = (uint)local_26b;
                                                ref_grid_local._4_4_ = 0;
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                                  ,0x24c,"ref_swap_conforming",
                                                  (ulong)ref_grid_local._4_4_,"area2");
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                                  ,0x24b,"ref_swap_conforming",
                                                  (ulong)ref_grid_local._4_4_,"uv area");
                                          }
                                        }
                                        else {
                                          ref_grid_local._4_4_ = 0;
                                        }
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                             ,0x247,"ref_swap_conforming",
                                             (ulong)ref_grid_local._4_4_,"allow a swap to");
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                           ,0x242,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,
                                           "area2");
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                         ,0x241,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,
                                         "uv area");
                                }
                              }
                              else {
                                ref_grid_local._4_4_ = 0;
                              }
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                   ,0x23d,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,
                                   "allow a swap to");
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                 ,0x238,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,"nd1");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                               ,0x237,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,"nodes tri1"
                              );
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                             ,0x236,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,"nd0");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                           ,0x235,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,"nodes tri0");
                  }
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                       ,0x20f,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,"tri support");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                     ,0x20e,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,"nodes");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x20d,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,"tri support");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x20c,"ref_swap_conforming",(ulong)ref_grid_local._4_4_,"nodes");
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x20b,"ref_swap_conforming","there should be two triangles for manifold",2,
               (long)cell_to_swap[0]);
        ref_grid_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x20a,
             "ref_swap_conforming",(ulong)ref_grid_local._4_4_,"more then two");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x207,
           "ref_swap_conforming",(ulong)ref_grid_local._4_4_,"other nodes");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_swap_conforming(REF_GRID ref_grid, REF_INT node0,
                                       REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT ncell, cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node2, node3;
  REF_BOOL cell0_support, cell1_support;
  REF_DBL normdev0, normdev1, normdev2, normdev3;
  REF_DBL sign_uv_area, uv_area2, uv_area3, area2, area3;
  REF_BOOL normdev_allowed, uv_area_allowed;
  REF_BOOL supported;
  REF_DBL normal0[3], normal1[3], normal2[3], normal3[3], dot;

  *allowed = REF_FALSE;

  RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3), "other nodes");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two");
  REIS(2, ncell, "there should be two triangles for manifold");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes");
  RSS(ref_geom_tri_supported(ref_geom, nodes, &cell0_support), "tri support");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes");
  RSS(ref_geom_tri_supported(ref_geom, nodes, &cell1_support), "tri support");

  if (!cell0_support || !cell1_support) {
    RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes");
    RSS(ref_node_tri_normal(ref_node, nodes, normal0), "tri 0 normal");
    RSS(ref_math_normalize(normal0), "triangle 0 has zero area");
    RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes");
    RSS(ref_node_tri_normal(ref_node, nodes, normal1), "tri 1 normal");
    RSS(ref_math_normalize(normal1), "triangle 1 has zero area");
    dot = ref_math_dot(normal0, normal1);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    nodes[0] = node0;
    nodes[1] = node3;
    nodes[2] = node2;
    RSS(ref_node_tri_normal(ref_node, nodes, normal2), "tri 2 normal");
    nodes[0] = node1;
    nodes[1] = node2;
    nodes[2] = node3;
    RSS(ref_node_tri_normal(ref_node, nodes, normal3), "tri 3 normal");
    dot = MIN(ref_math_dot(normal2, normal2), ref_math_dot(normal3, normal3));
    if (!ref_math_divisible(1.0, dot)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    RSS(ref_math_normalize(normal2), "triangle 2 has zero area");
    RSS(ref_math_normalize(normal3), "triangle 3 has zero area");
    dot = ref_math_dot(normal2, normal3);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev0), "nd0");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes tri1");
  RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev1), "nd1");
  nodes[0] = node0;
  nodes[1] = node3;
  nodes[2] = node2;
  RSS(ref_geom_cell_tuv_supported(ref_geom, nodes, REF_GEOM_FACE, &supported),
      "allow a swap to");
  if (!supported) return REF_SUCCESS;
  if (REF_SUCCESS != ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev2))
    return REF_SUCCESS;
  RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area2), "uv area");
  RSS(ref_node_tri_area(ref_node, nodes, &area2), "area2");
  nodes[0] = node1;
  nodes[1] = node2;
  nodes[2] = node3;
  RSS(ref_geom_cell_tuv_supported(ref_geom, nodes, REF_GEOM_FACE, &supported),
      "allow a swap to");
  if (!supported) return REF_SUCCESS;
  if (REF_SUCCESS != ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev3))
    return REF_SUCCESS;
  RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area3), "uv area");
  RSS(ref_node_tri_area(ref_node, nodes, &area3), "area2");

  normdev_allowed =
      ((MIN(normdev2, normdev3) > MIN(normdev0, normdev1)) ||
       ((MIN(normdev2, normdev3) > 0.9 * MIN(normdev0, normdev1)) &&
        (normdev2 > ref_grid_adapt(ref_grid, post_min_normdev) &&
         normdev3 > ref_grid_adapt(ref_grid, post_min_normdev))));

  normdev_allowed = normdev_allowed &&
                    (area2 > ref_node_min_volume(ref_node)) &&
                    (area3 > ref_node_min_volume(ref_node));

  /* skip uv checks for meshlink */
  if (ref_geom_meshlinked(ref_geom)) {
    *allowed = normdev_allowed;
    return REF_SUCCESS;
  }

  RSS(ref_geom_uv_area_sign(ref_grid, nodes[ref_cell_node_per(ref_cell)],
                            &sign_uv_area),
      "uv area sign");

  uv_area_allowed = (sign_uv_area * uv_area2 > ref_node_min_uv_area(ref_node) &&
                     sign_uv_area * uv_area3 > ref_node_min_uv_area(ref_node));

  if (normdev_allowed && uv_area_allowed) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}